

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.cpp
# Opt level: O2

Options * __thiscall
ApprovalTests::Options::withNamer
          (Options *__return_storage_ptr__,Options *this,
          shared_ptr<ApprovalTests::ApprovalNamer> *namer)

{
  bool usingDefaultScrubber;
  Reporter *reporter;
  shared_ptr<ApprovalTests::ApprovalNamer> local_78;
  undefined1 local_60 [40];
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_38;
  
  FileOptions::FileOptions((FileOptions *)local_60,&this->fileOptions_);
  ::std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::function(&local_38,&this->scrubber_);
  reporter = this->reporter_;
  usingDefaultScrubber = this->usingDefaultScrubber_;
  local_78.super___shared_ptr<ApprovalTests::ApprovalNamer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (namer->super___shared_ptr<ApprovalTests::ApprovalNamer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_78.super___shared_ptr<ApprovalTests::ApprovalNamer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (namer->super___shared_ptr<ApprovalTests::ApprovalNamer,_(__gnu_cxx::_Lock_policy)2>).
          _M_refcount._M_pi;
  (namer->super___shared_ptr<ApprovalTests::ApprovalNamer,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (namer->super___shared_ptr<ApprovalTests::ApprovalNamer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)0x0;
  Options(__return_storage_ptr__,(FileOptions *)local_60,&local_38,reporter,usingDefaultScrubber,
          &local_78);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_78.super___shared_ptr<ApprovalTests::ApprovalNamer,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  ::std::_Function_base::~_Function_base(&local_38.super__Function_base);
  ::std::__cxx11::string::~string((string *)(local_60 + 8));
  return __return_storage_ptr__;
}

Assistant:

Options Options::withNamer(std::shared_ptr<ApprovalNamer> namer)
    {
        return Options(
            fileOptions_, scrubber_, reporter_, usingDefaultScrubber_, std::move(namer));
    }